

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElectromagneticEmissionBeamData.cpp
# Opt level: O2

int __thiscall
DIS::ElectromagneticEmissionBeamData::getMarshalledSize(ElectromagneticEmissionBeamData *this)

{
  pointer pTVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  ulong uVar5;
  long lVar6;
  TrackJamData listElement;
  
  iVar2 = EEFundamentalParameterData::getMarshalledSize(&this->_fundamentalParameterData);
  iVar3 = BeamData::getMarshalledSize(&this->_beamData);
  iVar4 = JammingTechnique::getMarshalledSize(&this->_jammingTechnique);
  iVar2 = iVar4 + iVar3 + iVar2 + 8;
  lVar6 = 0x28;
  uVar5 = 0;
  while( true ) {
    pTVar1 = (this->_trackJamTargets).
             super__Vector_base<DIS::TrackJamData,_std::allocator<DIS::TrackJamData>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((ulong)(((long)(this->_trackJamTargets).
                       super__Vector_base<DIS::TrackJamData,_std::allocator<DIS::TrackJamData>_>.
                       _M_impl.super__Vector_impl_data._M_finish - (long)pTVar1) / 0x30) <= uVar5)
    break;
    listElement._vptr_TrackJamData = (_func_int **)&PTR__TrackJamData_001c3470;
    listElement._entityID._vptr_EntityID = (_func_int **)&PTR__EntityID_001c15b0;
    listElement._entityID._simulationAddress._vptr_SimulationAddress =
         (_func_int **)&PTR__SimulationAddress_001c2fb8;
    listElement._entityID._simulationAddress._8_4_ = *(undefined4 *)((long)pTVar1 + lVar6 + -0x10);
    listElement._entityID._entityNumber = *(unsigned_short *)((long)pTVar1 + lVar6 + -8);
    listElement._40_2_ = *(undefined2 *)((long)&pTVar1->_vptr_TrackJamData + lVar6);
    iVar3 = TrackJamData::getMarshalledSize(&listElement);
    iVar2 = iVar2 + iVar3;
    TrackJamData::~TrackJamData(&listElement);
    uVar5 = uVar5 + 1;
    lVar6 = lVar6 + 0x30;
  }
  return iVar2;
}

Assistant:

int ElectromagneticEmissionBeamData::getMarshalledSize() const
{
   int marshalSize = 0;

   marshalSize = marshalSize + 1;  // _beamDataLength
   marshalSize = marshalSize + 1;  // _beamIDNumber
   marshalSize = marshalSize + 2;  // _beamParameterIndex
   marshalSize = marshalSize + _fundamentalParameterData.getMarshalledSize();  // _fundamentalParameterData
   marshalSize = marshalSize + _beamData.getMarshalledSize();  // _beamData
   marshalSize = marshalSize + 1;  // _beamFunction
   marshalSize = marshalSize + 1;  // _numberOfTrackJamTargets
   marshalSize = marshalSize + 1;  // _highDensityTrackJam
   marshalSize = marshalSize + 1;  // _beamStatus
   marshalSize = marshalSize + _jammingTechnique.getMarshalledSize();  // _jammingTechnique

   for(unsigned long long idx=0; idx < _trackJamTargets.size(); idx++)
   {
        TrackJamData listElement = _trackJamTargets[idx];
        marshalSize = marshalSize + listElement.getMarshalledSize();
    }

    return marshalSize;
}